

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O3

BOOL read_repeat_counts(PCRE2_SPTR8 *ptrptr,PCRE2_SPTR8 ptrend,uint32_t *minp,uint32_t *maxp,
                       int *errorcodeptr)

{
  bool bVar1;
  uint uVar2;
  BOOL BVar3;
  PCRE2_SPTR8 ptr;
  byte *pbVar4;
  byte *pbVar5;
  PCRE2_SPTR8 pPVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  PCRE2_SPTR8 ptr_1;
  byte *pbVar10;
  long lVar11;
  bool bVar12;
  
  pbVar4 = *ptrptr;
  *errorcodeptr = 0;
  if (pbVar4 < ptrend) {
    bVar12 = true;
    do {
      bVar7 = *pbVar4;
      if ((bVar7 != 0x20) && (bVar7 != 9)) {
        pbVar5 = pbVar4;
        if (9 < (byte)(bVar7 - 0x30)) goto LAB_00183169;
        goto LAB_0018323e;
      }
      pbVar4 = pbVar4 + 1;
      bVar12 = pbVar4 < ptrend;
    } while (pbVar4 != ptrend);
    bVar12 = false;
    bVar1 = true;
    pbVar4 = ptrend;
    pbVar5 = ptrend;
  }
  else {
    bVar12 = false;
LAB_00183169:
    bVar1 = true;
    pbVar5 = pbVar4;
  }
  goto LAB_0018316c;
  while ((byte)(*pbVar5 - 0x30) < 10) {
LAB_0018323e:
    pbVar5 = pbVar5 + 1;
    if (ptrend <= pbVar5) break;
  }
  bVar1 = false;
LAB_0018316c:
  if (ptrend <= pbVar5) {
    return 0;
  }
  lVar11 = (long)ptrend - (long)pbVar5;
  do {
    pbVar10 = pbVar5 + 1;
    bVar7 = *pbVar5;
    if (bVar7 < 0x20) {
      if (bVar7 != 9) {
        return 0;
      }
    }
    else if (bVar7 != 0x20) {
      if (bVar7 == 0x2c) break;
      if (bVar7 != 0x7d) {
        return 0;
      }
      if (bVar1) {
        return 0;
      }
      goto LAB_001831bb;
    }
    lVar11 = lVar11 + -1;
    pbVar5 = pbVar10;
    if (lVar11 == 0) {
      return 0;
    }
  } while( true );
  while( true ) {
    if (ptrend <= pbVar10) {
      return 0;
    }
    bVar7 = *pbVar10;
    if ((bVar7 != 0x20) && (bVar7 != 9)) break;
    pbVar10 = pbVar10 + 1;
  }
  if ((byte)(bVar7 - 0x30) < 10) {
    do {
      pbVar10 = pbVar10 + 1;
      if (ptrend <= pbVar10) break;
    } while ((byte)(*pbVar10 - 0x30) < 10);
  }
  else if (bVar1) {
    return 0;
  }
  if (ptrend <= pbVar10) {
    return 0;
  }
  lVar11 = 0;
  while ((bVar7 = pbVar10[lVar11], bVar7 == 9 || (bVar7 == 0x20))) {
    lVar11 = lVar11 + 1;
    if ((long)ptrend - (long)pbVar10 == lVar11) {
      return 0;
    }
  }
  if (bVar7 != 0x7d) {
    return 0;
  }
LAB_001831bb:
  if ((bVar12) && ((byte)(*pbVar4 - 0x30) < 10)) {
    uVar2 = 0;
    do {
      pbVar5 = pbVar4;
      if (ptrend <= pbVar4) goto LAB_00183279;
      bVar7 = *pbVar4;
      if (9 < (byte)(bVar7 - 0x30)) goto LAB_0018325e;
      pbVar4 = pbVar4 + 1;
      uVar2 = ((uint)bVar7 + uVar2 * 10) - 0x30;
    } while (uVar2 < 0x10000);
    *errorcodeptr = 0x69;
LAB_0018344d:
    BVar3 = 0;
    goto LAB_001833b8;
  }
  pbVar5 = pbVar4 + 1;
  uVar8 = 0x10000;
  uVar2 = 0;
  if (pbVar5 < ptrend) {
    pPVar6 = ptrend + ~(ulong)pbVar4;
    pbVar4 = pbVar5;
    do {
      if ((*pbVar4 != 0x20) && (*pbVar4 != 9)) {
        pbVar5 = pbVar4;
        if (9 < (byte)(*pbVar4 - 0x30)) goto LAB_00183378;
        uVar8 = 0;
        goto LAB_00183340;
      }
      pbVar4 = pbVar4 + 1;
      pPVar6 = pPVar6 + -1;
      pbVar5 = ptrend;
      uVar9 = 0x10000;
    } while (pPVar6 != (PCRE2_SPTR8)0x0);
  }
  else {
LAB_00183378:
    uVar2 = 0;
    uVar9 = uVar8;
  }
  goto LAB_0018337b;
LAB_00183340:
  do {
    pbVar5 = pbVar4;
    if ((ptrend <= pbVar4) || (bVar7 = *pbVar4, 9 < (byte)(bVar7 - 0x30))) goto LAB_00183378;
    pbVar4 = pbVar4 + 1;
    uVar8 = ((uint)bVar7 + uVar8 * 10) - 0x30;
  } while (uVar8 < 0x10000);
  goto LAB_0018336a;
  while( true ) {
    pbVar4 = pbVar4 + 1;
    uVar9 = ((uint)bVar7 + uVar9 * 10) - 0x30;
    if (0xffff < uVar9) break;
LAB_0018340b:
    if ((ptrend <= pbVar4) || (bVar7 = *pbVar4, 9 < (byte)(bVar7 - 0x30))) goto LAB_0018343d;
  }
LAB_0018336a:
  *errorcodeptr = 0x69;
  BVar3 = 0;
  goto LAB_001833b8;
  while (pbVar4 = pbVar4 + 1, pbVar5 = ptrend, pbVar4 < ptrend) {
LAB_0018325e:
    bVar7 = *pbVar4;
    if ((bVar7 != 0x20) && (pbVar5 = pbVar4, bVar7 != 9)) goto LAB_0018327c;
  }
LAB_00183279:
  bVar7 = *pbVar5;
LAB_0018327c:
  uVar9 = uVar2;
  if (bVar7 != 0x7d) {
    pbVar4 = pbVar5 + 1;
    uVar9 = 0x10000;
    if (pbVar4 < ptrend) {
      pPVar6 = ptrend + ~(ulong)pbVar5;
      pbVar5 = pbVar4;
      do {
        pbVar4 = pbVar5;
        if ((*pbVar4 != 0x20) && (*pbVar4 != 9)) {
          if ((byte)(*pbVar4 - 0x30) < 10) {
            uVar9 = 0;
            goto LAB_0018340b;
          }
          break;
        }
        pbVar5 = pbVar4 + 1;
        pPVar6 = pPVar6 + -1;
        pbVar4 = ptrend;
      } while (pPVar6 != (PCRE2_SPTR8)0x0);
    }
LAB_0018343d:
    pbVar5 = pbVar4;
    if ((int)uVar9 < (int)uVar2) {
      *errorcodeptr = 0x68;
      goto LAB_0018344d;
    }
  }
LAB_0018337b:
  pbVar4 = pbVar5;
  if (pbVar5 < ptrend) {
    lVar11 = (long)ptrend - (long)pbVar5;
    do {
      if ((*pbVar5 != 0x20) && (pbVar4 = pbVar5, *pbVar5 != 9)) break;
      pbVar5 = pbVar5 + 1;
      lVar11 = lVar11 + -1;
      pbVar4 = ptrend;
    } while (lVar11 != 0);
  }
  if (minp != (uint32_t *)0x0) {
    *minp = uVar2;
  }
  pbVar4 = pbVar4 + 1;
  BVar3 = 1;
  if (maxp != (uint32_t *)0x0) {
    *maxp = uVar9;
  }
LAB_001833b8:
  *ptrptr = pbVar4;
  return BVar3;
}

Assistant:

static BOOL
read_repeat_counts(PCRE2_SPTR *ptrptr, PCRE2_SPTR ptrend, uint32_t *minp,
  uint32_t *maxp, int *errorcodeptr)
{
PCRE2_SPTR p = *ptrptr;
PCRE2_SPTR pp;
BOOL yield = FALSE;
BOOL had_minimum = FALSE;
int32_t min = 0;
int32_t max = REPEAT_UNLIMITED; /* This value is larger than MAX_REPEAT_COUNT */

*errorcodeptr = 0;
while (p < ptrend && (*p == CHAR_SPACE || *p == CHAR_HT)) p++;

/* Check the syntax before interpreting. Otherwise, a non-quantifier sequence
such as "X{123456ABC" would incorrectly give a "number too big in quantifier"
error. */

pp = p;
if (pp < ptrend && IS_DIGIT(*pp))
  {
  had_minimum = TRUE;
  while (++pp < ptrend && IS_DIGIT(*pp)) {}
  }

while (pp < ptrend && (*pp == CHAR_SPACE || *pp == CHAR_HT)) pp++;
if (pp >= ptrend) return FALSE;

if (*pp == CHAR_RIGHT_CURLY_BRACKET)
  {
  if (!had_minimum) return FALSE;
  }
else
  {
  if (*pp++ != CHAR_COMMA) return FALSE;
  while (pp < ptrend && (*pp == CHAR_SPACE || *pp == CHAR_HT)) pp++;
  if (pp >= ptrend) return FALSE;
  if (IS_DIGIT(*pp))
    {
    while (++pp < ptrend && IS_DIGIT(*pp)) {}
    }
  else if (!had_minimum) return FALSE;
  while (pp < ptrend && (*pp == CHAR_SPACE || *pp == CHAR_HT)) pp++;
  if (pp >= ptrend || *pp != CHAR_RIGHT_CURLY_BRACKET) return FALSE;
  }

/* Now process the quantifier for real. We know it must be {n} or (n,} or {,m}
or {n,m}. The only error that read_number() can return is for a number that is
too big. If *errorcodeptr is returned as zero it means no number was found. */

/* Deal with {,m} or n too big. If we successfully read m there is no need to
check m >= n because n defaults to zero. */

if (!read_number(&p, ptrend, -1, MAX_REPEAT_COUNT, ERR5, &min, errorcodeptr))
  {
  if (*errorcodeptr != 0) goto EXIT;    /* n too big */
  p++;  /* Skip comma and subsequent spaces */
  while (p < ptrend && (*p == CHAR_SPACE || *p == CHAR_HT)) p++;
  if (!read_number(&p, ptrend, -1, MAX_REPEAT_COUNT, ERR5, &max, errorcodeptr))
    {
    if (*errorcodeptr != 0) goto EXIT;  /* m too big */
    }
  }

/* Have read one number. Deal with {n} or {n,} or {n,m} */

else
  {
  while (p < ptrend && (*p == CHAR_SPACE || *p == CHAR_HT)) p++;
  if (*p == CHAR_RIGHT_CURLY_BRACKET)
    {
    max = min;
    }
  else   /* Handle {n,} or {n,m} */
    {
    p++;    /* Skip comma and subsequent spaces */
    while (p < ptrend && (*p == CHAR_SPACE || *p == CHAR_HT)) p++;
    if (!read_number(&p, ptrend, -1, MAX_REPEAT_COUNT, ERR5, &max, errorcodeptr))
      {
      if (*errorcodeptr != 0) goto EXIT;   /* m too big */
      }

    if (max < min)
      {
      *errorcodeptr = ERR4;
      goto EXIT;
      }
    }
  }

/* Valid quantifier exists */

while (p < ptrend && (*p == CHAR_SPACE || *p == CHAR_HT)) p++;
p++;
yield = TRUE;
if (minp != NULL) *minp = (uint32_t)min;
if (maxp != NULL) *maxp = (uint32_t)max;

/* Update the pattern pointer */

EXIT:
*ptrptr = p;
return yield;
}